

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

string * __thiscall
pstack::Elf::Object::getInterpreter_abi_cxx11_(string *__return_storage_ptr__,Object *this)

{
  pointer paVar1;
  element_type *peVar2;
  ProgramHeaders *pPVar3;
  anon_struct_56_8_fb3e104e *seg;
  
  pPVar3 = getSegments(this,3);
  paVar1 = (pPVar3->super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar1 == (pPVar3->super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    peVar2 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Reader[7])(__return_storage_ptr__,peVar2,paVar1->p_offset);
  }
  return __return_storage_ptr__;
}

Assistant:

string
Object::getInterpreter() const
{
    for (auto &seg : getSegments(PT_INTERP))
        return io->readString(seg.p_offset);
    return "";
}